

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O3

error_code llvm::sys::fs::copy_file_internal(int ReadFD,int WriteFD)

{
  void *__buf;
  ulong uVar1;
  ssize_t sVar2;
  uint *puVar3;
  error_category *peVar4;
  uint uVar5;
  error_code eVar6;
  
  __buf = operator_new__(0x1000);
  do {
    uVar1 = read(ReadFD,__buf,0x1000);
    if ((int)uVar1 < 1) {
      operator_delete__(__buf);
      if ((int)uVar1 < 0) {
LAB_001599e5:
        puVar3 = (uint *)__errno_location();
        uVar5 = *puVar3;
        peVar4 = (error_category *)std::_V2::generic_category();
      }
      else {
        uVar5 = 0;
        peVar4 = (error_category *)std::_V2::system_category();
      }
      eVar6._4_4_ = 0;
      eVar6._M_value = uVar5;
      eVar6._M_cat = peVar4;
      return eVar6;
    }
    do {
      sVar2 = write(WriteFD,__buf,(long)(int)uVar1);
      if ((int)sVar2 < 0) {
        operator_delete__(__buf);
        goto LAB_001599e5;
      }
      uVar5 = (int)uVar1 - (int)sVar2;
      uVar1 = (ulong)uVar5;
    } while (uVar5 != 0);
  } while( true );
}

Assistant:

static std::error_code copy_file_internal(int ReadFD, int WriteFD) {
  const size_t BufSize = 4096;
  char *Buf = new char[BufSize];
  int BytesRead = 0, BytesWritten = 0;
  for (;;) {
    BytesRead = read(ReadFD, Buf, BufSize);
    if (BytesRead <= 0)
      break;
    while (BytesRead) {
      BytesWritten = write(WriteFD, Buf, BytesRead);
      if (BytesWritten < 0)
        break;
      BytesRead -= BytesWritten;
    }
    if (BytesWritten < 0)
      break;
  }
  delete[] Buf;

  if (BytesRead < 0 || BytesWritten < 0)
    return std::error_code(errno, std::generic_category());
  return std::error_code();
}